

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O0

void __thiscall QAccessibleTabBar::QAccessibleTabBar(QAccessibleTabBar *this,QWidget *w)

{
  long lVar1;
  undefined8 in_RSI;
  Role role;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QWidget *w_00;
  QAccessibleWidget *in_stack_ffffffffffffffe0;
  
  role = (Role)((ulong)in_RSI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  w_00 = in_RDI;
  QString::QString((QString *)0x7d4102);
  QAccessibleWidget::QAccessibleWidget(in_stack_ffffffffffffffe0,w_00,role,(QString *)in_RDI);
  QString::~QString((QString *)0x7d4124);
  QAccessibleSelectionInterface::QAccessibleSelectionInterface
            ((QAccessibleSelectionInterface *)&in_RDI->data);
  *(undefined ***)in_RDI = &PTR__QAccessibleTabBar_00d27450;
  *(undefined ***)&in_RDI->super_QPaintDevice = &PTR__QAccessibleTabBar_00d27560;
  in_RDI->data = (QWidgetData *)&PTR__QAccessibleTabBar_00d275a8;
  QHash<int,_unsigned_int>::QHash((QHash<int,_unsigned_int> *)(in_RDI + 1));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleTabBar::QAccessibleTabBar(QWidget *w)
: QAccessibleWidget(w, QAccessible::PageTabList)
{
    Q_ASSERT(tabBar());
}